

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_loadImageDataInt
          (ktxTexture2 *This,ktx_uint8_t *pBuffer,ktx_size_t bufSize,
          ktxTexture2InflateFlagEnum inflateHandling)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  int in_ECX;
  ulong in_RDX;
  void *in_RSI;
  ktx_size_t in_RDI;
  ktx_bool_t doInflate;
  ktx_uint8_t *unaff_retaddr;
  ktx_size_t outputDataCapacity;
  ktx_uint8_t *in_stack_00000010;
  ktx_error_code_e result;
  ktx_uint8_t *pReadBuf;
  ktx_uint8_t *pDeflatedData;
  ktx_uint8_t *pDest;
  ktxTexture2_private *private;
  ktxTexture_protected *prtctd;
  size_t local_60;
  ktx_error_code_e local_54;
  void *local_50;
  void *local_48;
  void *local_40;
  ktxTexture2 *This_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  This_00 = *(ktxTexture2 **)(in_RDI + 0xa0);
  local_48 = (void *)0x0;
  bVar2 = false;
  if (in_RDI == 0) {
    return KTX_INVALID_VALUE;
  }
  if (*(long *)(in_RDI + 0x70) != 0) {
    return KTX_INVALID_OPERATION;
  }
  if (*(long *)(lVar1 + 0x80) == 0) {
    return KTX_INVALID_OPERATION;
  }
  if (in_ECX == 1) {
    local_60 = ktxTexture2_GetDataSizeUncompressed(This_00);
    if ((*(int *)(in_RDI + 0x88) == 2) || (*(int *)(in_RDI + 0x88) == 3)) {
      bVar2 = true;
    }
  }
  else {
    local_60 = *(size_t *)(in_RDI + 0x68);
  }
  if (in_RSI == (void *)0x0) {
    pvVar3 = malloc(local_60);
    *(void **)(in_RDI + 0x70) = pvVar3;
    if (*(long *)(in_RDI + 0x70) == 0) {
      return KTX_OUT_OF_MEMORY;
    }
    local_40 = *(void **)(in_RDI + 0x70);
  }
  else {
    local_40 = in_RSI;
    if (in_RDX < local_60) {
      return KTX_INVALID_VALUE;
    }
  }
  if (bVar2) {
    local_50 = malloc(*(size_t *)(in_RDI + 0x68));
    local_48 = local_50;
    if (local_50 == (void *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
  }
  else {
    local_50 = local_40;
  }
  local_54 = (**(code **)(lVar1 + 0x60))(lVar1 + 0x40,This_00->_protected);
  if ((local_54 == KTX_SUCCESS) &&
     (local_54 = (**(code **)(lVar1 + 0x40))(lVar1 + 0x40,local_50,*(undefined8 *)(in_RDI + 0x68)),
     local_54 == KTX_SUCCESS)) {
    if (bVar2) {
      if (local_48 == (void *)0x0) {
        __assert_fail("pDeflatedData != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                      ,0xa30,
                      "ktx_error_code_e ktxTexture2_loadImageDataInt(ktxTexture2 *, ktx_uint8_t *, ktx_size_t, ktxTexture2InflateFlagEnum)"
                     );
      }
      if (*(int *)(in_RDI + 0x88) == 2) {
        local_54 = ktxTexture2_inflateZstdInt
                             ((ktxTexture2 *)pReadBuf,in_stack_00000010,
                              (ktx_uint8_t *)outputDataCapacity,(ktx_size_t)unaff_retaddr);
      }
      else if (*(int *)(in_RDI + 0x88) == 3) {
        local_54 = ktxTexture2_inflateZLIBInt
                             ((ktxTexture2 *)outputDataCapacity,unaff_retaddr,
                              (ktx_uint8_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      }
      if (local_54 != KTX_SUCCESS) {
        if (in_RSI == (void *)0x0) {
          free(*(void **)(in_RDI + 0x70));
          *(undefined8 *)(in_RDI + 0x70) = 0;
        }
        goto LAB_004661fa;
      }
    }
    (**(code **)(lVar1 + 0x70))(lVar1 + 0x40);
    This_00->_protected = (ktxTexture_protected *)0x0;
  }
LAB_004661fa:
  free(local_48);
  return local_54;
}

Assistant:

ktx_error_code_e
ktxTexture2_loadImageDataInt(ktxTexture2* This,
                             ktx_uint8_t* pBuffer, ktx_size_t bufSize,
                             ktxTexture2InflateFlagEnum inflateHandling)
{
    DECLARE_PROTECTED(ktxTexture);
    DECLARE_PRIVATE(ktxTexture2);
    ktx_uint8_t*    pDest;
    ktx_uint8_t*    pDeflatedData = NULL;
    ktx_uint8_t*    pReadBuf;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_size_t outputDataCapacity;
    ktx_bool_t doInflate = false;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->pData != NULL)
        return KTX_INVALID_OPERATION; // Data already loaded.

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images already loaded;
        return KTX_INVALID_OPERATION;

    if (inflateHandling == LOADDATA_INFLATE_ON_LOAD) {
        outputDataCapacity = ktxTexture2_GetDataSizeUncompressed(This);
        if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB)
            doInflate = true;
    } else {
        outputDataCapacity = This->dataSize;
    }

    if (pBuffer == NULL) {
        This->pData = malloc(outputDataCapacity);
        if (This->pData == NULL)
            return KTX_OUT_OF_MEMORY;
        pDest = This->pData;
    } else if (bufSize < outputDataCapacity) {
        return KTX_INVALID_VALUE;
    } else {
        pDest = pBuffer;
    }

    if (doInflate) {
        // Create buffer to hold deflated data.
        pDeflatedData = malloc(This->dataSize);
        if (pDeflatedData == NULL)
            return KTX_OUT_OF_MEMORY;
        pReadBuf = pDeflatedData;
    } else {
        pReadBuf = pDest;
    }

    // Seek to data for first level as there may be padding between the
    // metadata/sgd and the image data.

    result = prtctd->_stream.setpos(&prtctd->_stream,
                                    private->_firstLevelFileOffset);
    if (result != KTX_SUCCESS)
        goto cleanup;

    result = prtctd->_stream.read(&prtctd->_stream, pReadBuf,
                                  This->dataSize);
    if (result != KTX_SUCCESS)
        goto cleanup;

    if (doInflate) {
        assert(pDeflatedData != NULL);
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            result = ktxTexture2_inflateZstdInt(This, pDeflatedData, pDest,
                                                outputDataCapacity);
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxTexture2_inflateZLIBInt(This, pDeflatedData, pDest,
                                                outputDataCapacity);
        }
        if (result != KTX_SUCCESS) {
            if (pBuffer == NULL) {
                free(This->pData);
                This->pData = 0;
            }
            goto cleanup;
        }
    }

    if (IS_BIG_ENDIAN) {
        // Perform endianness conversion on texture data.
        // To avoid mip padding, need to convert each level individually.
        for (ktx_uint32_t level = 0; level < This->numLevels; ++level)
        {
            ktx_size_t levelOffset;
            ktx_size_t levelByteLength;

            levelByteLength = private->_levelIndex[level].byteLength;
            levelOffset = ktxTexture2_levelDataOffset(This, level);
            pDest = This->pData + levelOffset;
            switch (prtctd->_typeSize) {
              case 2:
                _ktxSwapEndian16((ktx_uint16_t*)pDest, levelByteLength / 2);
                break;
              case 4:
                _ktxSwapEndian32((ktx_uint32_t*)pDest, levelByteLength / 4);
                break;
              case 8:
                _ktxSwapEndian64((ktx_uint64_t*)pDest, levelByteLength / 8);
                break;
            }
        }
    }

    // No further need for stream or file offset.
    prtctd->_stream.destruct(&prtctd->_stream);
    private->_firstLevelFileOffset = 0;

cleanup:
    free(pDeflatedData);

    return result;
}